

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall QPDF::allowModifyForm(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  int P;
  int R;
  uint local_8 [2];
  
  local_8[0] = 0;
  local_8[1] = 0;
  bVar1 = isEncrypted(this,(int *)(local_8 + 1),(int *)local_8);
  bVar2 = true;
  if (bVar1) {
    if ((int)local_8[1] < 3) {
      bVar2 = SUB41((local_8[0] & 0x20) >> 5,0);
    }
    else {
      bVar2 = (bool)(local_8[0]._1_1_ & 1);
    }
  }
  return bVar2;
}

Assistant:

bool
QPDF::allowModifyForm()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        if (R < 3) {
            status = is_bit_set(P, 6);
        } else {
            status = is_bit_set(P, 9);
        }
    }
    return status;
}